

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O3

int32 ps_get_prob(ps_decoder_t *ps)

{
  int32 iVar1;
  
  if (ps->search == (ps_search_t *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
            ,0x572,
            "No search module is selected, did you forget to specify a language model or grammar?\n"
           );
    iVar1 = -1;
  }
  else {
    ptmr_start(&ps->perf);
    iVar1 = (*ps->search->vt->prob)(ps->search);
    ptmr_stop(&ps->perf);
  }
  return iVar1;
}

Assistant:

int32
ps_get_prob(ps_decoder_t *ps)
{
    int32 prob;

    if (ps->search == NULL) {
        E_ERROR("No search module is selected, did you forget to "
                "specify a language model or grammar?\n");
        return -1;
    }
    ptmr_start(&ps->perf);
    prob = ps_search_prob(ps->search);
    ptmr_stop(&ps->perf);
    return prob;
}